

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license.cpp
# Opt level: O0

void license::create_license_path(string *license_file_name)

{
  bool bVar1;
  runtime_error *prVar2;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_50 [8];
  path parentPath;
  path license_name;
  string *license_file_name_local;
  
  boost::filesystem::path::path
            ((path *)((long)&parentPath.m_pathname.field_2 + 8),license_file_name);
  boost::filesystem::path::parent_path();
  bVar1 = boost::filesystem::path::empty((path *)local_50);
  if (!bVar1) {
    bVar1 = boost::filesystem::exists((path *)local_50);
    if (bVar1) {
      bVar1 = boost::filesystem::is_regular_file((path *)local_50);
      if (bVar1) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        psVar3 = boost::filesystem::path::string_abi_cxx11_((path *)local_50);
        std::operator+(&local_e8,"trying to create folder [",psVar3);
        std::operator+(&local_c8,&local_e8,"] but there is a file with the same name. ");
        std::runtime_error::runtime_error(prVar2,(string *)&local_c8);
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      bVar1 = boost::filesystem::create_directories((path *)local_50);
      if (!bVar1) {
        local_a1 = 1;
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        psVar3 = boost::filesystem::path::string_abi_cxx11_((path *)local_50);
        std::operator+(&local_a0,"Cannot create licenses directory [",psVar3);
        std::operator+(&local_80,&local_a0,"]");
        std::runtime_error::runtime_error(prVar2,(string *)&local_80);
        local_a1 = 0;
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  boost::filesystem::path::~path((path *)local_50);
  boost::filesystem::path::~path((path *)((long)&parentPath.m_pathname.field_2 + 8));
  return;
}

Assistant:

static void create_license_path(const string &license_file_name) {
	const fs::path license_name(license_file_name);
	fs::path parentPath = license_name.parent_path();
	if (!parentPath.empty()) {
		if (!fs::exists(parentPath)) {
			if (!fs::create_directories(parentPath)) {
				throw runtime_error("Cannot create licenses directory [" + parentPath.string() + "]");
			}
		} else if (fs::is_regular_file(parentPath)) {
			throw runtime_error("trying to create folder [" + parentPath.string() +
								"] but there is a file with the same name. ");
		}
	}
}